

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yy_5_method_postfix_expr
               (GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *n2;
  PVIPNode *pPVar1;
  PVIPNode *local_48;
  yythunk *thunk_local;
  int yyleng_local;
  char *yytext_local;
  GREG *G_local;
  
  pPVar1 = G->val[-5];
  n2 = G->val[-3];
  if (G->val[-2] == (PVIPNode *)0x0) {
    local_48 = PVIP_node_new_children(&G->data,PVIP_NODE_NOP);
  }
  else {
    local_48 = G->val[-2];
  }
  pPVar1 = PVIP_node_new_children3(&G->data,PVIP_NODE_META_METHOD_CALL,pPVar1,n2,local_48);
  G->ss = pPVar1;
  G->val[-5] = G->ss;
  return;
}

Assistant:

YY_ACTION(void) yy_5_method_postfix_expr(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define a G->val[-1]
#define f3 G->val[-2]
#define f2 G->val[-3]
#define k G->val[-4]
#define f1 G->val[-5]
  yyprintf((stderr, "do yy_5_method_postfix_expr"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
                yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_META_METHOD_CALL, f1, f2, MAYBE(f3));\n\
                f1=yy;\n\
            }\n"));
  
                yy = PVIP_node_new_children3(&(G->data), PVIP_NODE_META_METHOD_CALL, f1, f2, MAYBE(f3));
                f1=yy;
            ;
#undef a
#undef f3
#undef f2
#undef k
#undef f1
}